

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

void __thiscall QDebug::QDebug(QDebug *this,QString *string)

{
  Stream *pSVar1;
  
  pSVar1 = (Stream *)operator_new(0x58);
  QTextStream::QTextStream((QTextStream *)pSVar1,string,2);
  (pSVar1->buffer).d.d = (Data *)0x0;
  (pSVar1->buffer).d.ptr = (char16_t *)0x0;
  (pSVar1->buffer).d.size = 0;
  pSVar1->ref = 1;
  pSVar1->type = QtDebugMsg;
  pSVar1->space = true;
  pSVar1->noQuotes = false;
  pSVar1->message_output = false;
  pSVar1->verbosity = 2;
  (pSVar1->context).version = 2;
  *(undefined8 *)&(pSVar1->context).line = 0;
  *(undefined8 *)((long)&(pSVar1->context).file + 4) = 0;
  (pSVar1->context).function = (char *)0x0;
  (pSVar1->context).category = (char *)0x0;
  this->stream = pSVar1;
  return;
}

Assistant:

explicit QDebug(QString *string) : stream(new Stream(string)) {}